

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall
kratos::StmtBlock::set_child(StmtBlock *this,uint64_t index,shared_ptr<kratos::Stmt> *stmt)

{
  pointer psVar1;
  element_type *peVar2;
  
  psVar1 = (this->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (index < (ulong)((long)(this->stmts_).
                            super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4)) {
    std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&psVar1[index].super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>,
               &stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>);
    peVar2 = (stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar2->super_IRNode)._vptr_IRNode[7])(peVar2,this);
    return;
  }
  return;
}

Assistant:

void StmtBlock::set_child(uint64_t index, const std::shared_ptr<Stmt> &stmt) {
    if (index < stmts_.size()) {
        stmts_[index] = stmt;
        stmt->set_parent(this);
    }
}